

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionHeader::QStyleOptionHeader(QStyleOptionHeader *this,int version)

{
  undefined4 in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  QStyleOption::QStyleOption
            ((QStyleOption *)CONCAT44(version,in_stack_00000008),unaff_retaddr_00,unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  QString::QString((QString *)0x41cedc);
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (AlignmentFlag)((ulong)in_RDI >> 0x20));
  QIcon::QIcon((QIcon *)(in_RDI + 0x68));
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (AlignmentFlag)((ulong)in_RDI >> 0x20));
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 1;
  return;
}

Assistant:

QStyleOptionHeader::QStyleOptionHeader(int version)
    : QStyleOption(version, SO_Header),
      section(0), textAlignment(Qt::AlignLeft), iconAlignment(Qt::AlignLeft),
      position(QStyleOptionHeader::Beginning),
      selectedPosition(QStyleOptionHeader::NotAdjacent), sortIndicator(None),
      orientation(Qt::Horizontal)
{
}